

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t isint_w(wchar_t *start,wchar_t *end,wchar_t *result)

{
  wchar_t n;
  wchar_t *result_local;
  wchar_t *end_local;
  wchar_t *start_local;
  wchar_t local_4;
  
  n = L'\0';
  start_local = start;
  if (start < end) {
    for (; start_local < end; start_local = start_local + 1) {
      if ((*start_local < L'0') || (L'9' < *start_local)) {
        return L'\0';
      }
      if ((n < L'\x0ccccccd') && ((n != L'\x0ccccccc' || (*start_local + L'\xffffffd0' < 8)))) {
        n = *start_local + L'\xffffffd0' + n * 10;
      }
      else {
        n = L'\x7fffffff';
      }
    }
    *result = n;
    local_4 = L'\x01';
  }
  else {
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
isint_w(const wchar_t *start, const wchar_t *end, int *result)
{
	int n = 0;
	if (start >= end)
		return (0);
	while (start < end) {
		if (*start < '0' || *start > '9')
			return (0);
		if (n > (INT_MAX / 10) ||
		    (n == INT_MAX / 10 && (*start - '0') > INT_MAX % 10)) {
			n = INT_MAX;
		} else {
			n *= 10;
			n += *start - '0';
		}
		start++;
	}
	*result = n;
	return (1);
}